

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::update
          (QRotationGate2<std::complex<float>_> *this,real_type theta)

{
  int iVar1;
  real_type theta_local;
  QRotationGate2<std::complex<float>_> *this_local;
  
  iVar1 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[1])();
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!fixed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QRotationGate2.hpp"
                  ,0xbd,
                  "void qclab::qgates::QRotationGate2<std::complex<float>>::update(const real_type) [T = std::complex<float>]"
                 );
  }
  QRotation<float>::update(&this->rotation_,theta);
  return;
}

Assistant:

void update( const real_type theta ) {
          assert( !fixed() ) ;
          rotation_.update( theta ) ;
        }